

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  uint uVar1;
  BPMNode *local_88;
  BPMNode *node;
  BPMLists lists;
  BPMNode *leaves;
  size_t numpresent;
  uint local_30;
  uint i;
  uint error;
  uint maxbitlen_local;
  size_t numcodes_local;
  uint *frequencies_local;
  uint *lengths_local;
  
  local_30 = 0;
  leaves = (BPMNode *)0x0;
  if (numcodes == 0) {
    lengths_local._4_4_ = 0x50;
  }
  else if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < numcodes) {
    lengths_local._4_4_ = 0x50;
  }
  else {
    lists.chains1 = (BPMNode **)lodepng_malloc(numcodes * 0x18);
    if ((BPMNode *)lists.chains1 == (BPMNode *)0x0) {
      lengths_local._4_4_ = 0x53;
    }
    else {
      for (numpresent._4_4_ = 0; numpresent._4_4_ != numcodes;
          numpresent._4_4_ = numpresent._4_4_ + 1) {
        if (frequencies[numpresent._4_4_] != 0) {
          ((BPMNode *)((long)lists.chains1 + leaves * 0x18))->weight = frequencies[numpresent._4_4_]
          ;
          ((BPMNode *)((long)lists.chains1 + leaves * 0x18))->index = numpresent._4_4_;
          leaves = (BPMNode *)((long)&leaves->weight + 1);
        }
      }
      for (numpresent._4_4_ = 0; numpresent._4_4_ != numcodes;
          numpresent._4_4_ = numpresent._4_4_ + 1) {
        lengths[numpresent._4_4_] = 0;
      }
      if (leaves == (BPMNode *)0x0) {
        lengths[1] = 1;
        *lengths = 1;
      }
      else if (leaves == (BPMNode *)0x1) {
        lengths[((BPMNode *)lists.chains1)->index] = 1;
        lengths[(int)(uint)(((BPMNode *)lists.chains1)->index == 0)] = 1;
      }
      else {
        bpmnode_sort((BPMNode *)lists.chains1,(size_t)leaves);
        node._0_4_ = maxbitlen * 2 * (maxbitlen + 1);
        lists.memory._4_4_ = 0;
        lists.memory._0_4_ = (uint)node;
        lists.freelist._0_4_ = maxbitlen;
        lists._0_8_ = lodepng_malloc((ulong)(uint)node * 0x18);
        lists._16_8_ = lodepng_malloc((ulong)(uint)node << 3);
        lists._32_8_ = lodepng_malloc((ulong)(uint)lists.freelist << 3);
        lists.chains0 = (BPMNode **)lodepng_malloc((ulong)(uint)lists.freelist << 3);
        if ((((lists._0_8_ == 0) || (lists._16_8_ == 0)) || (lists._32_8_ == 0)) ||
           (lists.chains0 == (BPMNode **)0x0)) {
          local_30 = 0x53;
        }
        if (local_30 == 0) {
          for (numpresent._4_4_ = 0; numpresent._4_4_ != (uint)node;
              numpresent._4_4_ = numpresent._4_4_ + 1) {
            *(ulong *)(lists._16_8_ + (ulong)numpresent._4_4_ * 8) =
                 lists._0_8_ + (ulong)numpresent._4_4_ * 0x18;
          }
          bpmnode_create((BPMLists *)&node,*(int *)lists.chains1,1,(BPMNode *)0x0);
          bpmnode_create((BPMLists *)&node,*(int *)(lists.chains1 + 3),2,(BPMNode *)0x0);
          for (numpresent._4_4_ = 0; numpresent._4_4_ != (uint)lists.freelist;
              numpresent._4_4_ = numpresent._4_4_ + 1) {
            *(undefined8 *)(lists._32_8_ + (ulong)numpresent._4_4_ * 8) = lists._0_8_;
            lists.chains0[numpresent._4_4_] = (BPMNode *)(lists._0_8_ + 0x18);
          }
          for (numpresent._4_4_ = 2; (ulong)numpresent._4_4_ != (long)leaves * 2 - 2U;
              numpresent._4_4_ = numpresent._4_4_ + 1) {
            boundaryPM((BPMLists *)&node,(BPMNode *)lists.chains1,(size_t)leaves,maxbitlen - 1,
                       numpresent._4_4_);
          }
          for (local_88 = lists.chains0[maxbitlen - 1]; local_88 != (BPMNode *)0x0;
              local_88 = local_88->tail) {
            for (numpresent._4_4_ = 0; numpresent._4_4_ != local_88->index;
                numpresent._4_4_ = numpresent._4_4_ + 1) {
              uVar1 = *(uint *)((long)lists.chains1 + (ulong)numpresent._4_4_ * 0x18 + 4);
              lengths[uVar1] = lengths[uVar1] + 1;
            }
          }
        }
        lodepng_free((void *)lists._0_8_);
        lodepng_free((void *)lists._16_8_);
        lodepng_free((void *)lists._32_8_);
        lodepng_free(lists.chains0);
      }
      lodepng_free(lists.chains1);
      lengths_local._4_4_ = local_30;
    }
  }
  return lengths_local._4_4_;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}